

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict_manager.cpp
# Opt level: O3

void __thiscall duckdb::ConflictManager::FinishLookup(ConflictManager *this)

{
  if (((this->mode != THROW) &&
      (optional_ptr<duckdb::ConflictInfo,_true>::CheckValid(&this->conflict_info),
      (((this->conflict_info).ptr)->column_ids->_M_h)._M_element_count != 0)) &&
     ((this->conflicts).count != 0)) {
    this->single_index_finished = true;
  }
  return;
}

Assistant:

void ConflictManager::FinishLookup() {
	if (mode == ConflictManagerMode::THROW) {
		return;
	}
	if (!SingleIndexTarget()) {
		return;
	}
	if (conflicts.Count() != 0) {
		// We have recorded conflicts from the one index we're interested in
		// We set this so we don't duplicate the conflicts when there are duplicate indexes
		// that also match our conflict target
		single_index_finished = true;
	}
}